

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsGenerator.cxx
# Opt level: O0

void __thiscall kws::Generator::Generator(Generator *this)

{
  undefined8 *in_RDI;
  
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::__cxx11::string::string((string *)(in_RDI + 5));
  std::__cxx11::string::string((string *)(in_RDI + 9));
  *in_RDI = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 5),"Logo.gif");
  std::__cxx11::string::operator=((string *)(in_RDI + 9),"kwstylelogo.jpg");
  *(undefined4 *)(in_RDI + 0xd) = 99;
  *(undefined4 *)((long)in_RDI + 0x6c) = 0;
  return;
}

Assistant:

Generator::Generator()
{
  m_Parsers = nullptr;
  m_ProjectTitle = "";
  m_ProjectLogo = "Logo.gif";
  m_KWStyleLogo = "kwstylelogo.jpg";
  m_MaxDirectoryDepth = 99;
  m_ErrorThreshold = 0;
}